

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

size_t rtosc_print_arg_val(rtosc_arg_val_t *arg,char *buffer,size_t bs,rtosc_print_options *opt,
                          int *cols_used,rtosc_arg_val_t *prev_arg_if_range)

{
  long lVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  int32_t iVar6;
  int iVar7;
  rtosc_arg_t *arg_00;
  tm_conflict *__tp;
  uint64_t uVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  ushort **ppuVar12;
  undefined1 *puVar13;
  bool bVar14;
  undefined8 uStackY_1d0;
  uint local_1c8 [2];
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  rtosc_arg_val_t *in_stack_fffffffffffffe50;
  rtosc_arg_val_t *prev_arg_if_range_00;
  rtosc_arg_val_t *local_1a8;
  uint64_t in_stack_fffffffffffffe60;
  int *local_190;
  int *local_188;
  char *in_stack_fffffffffffffe80;
  rtosc_arg_val_t *arg_01;
  uint local_15c;
  char *local_128;
  ulong local_120;
  int local_114;
  size_t sStack_110;
  int _n1_1;
  size_t tmp_1;
  rtosc_arg_val_t *input;
  int32_t conv;
  int32_t i_1;
  unsigned_long __vla_expr0;
  int args_written_this_line;
  char *last_sep;
  int _n1;
  int _n2;
  int tmp;
  int32_t i;
  int as_esc;
  char *s_1;
  char *b;
  char *s;
  _Bool plain;
  int *piStack_a0;
  int is_esc;
  char *last_pos_1;
  undefined1 auStack_90 [3];
  char fmtstr_1 [9];
  int prec_1;
  char *last_pos;
  char *sep;
  char local_70 [4];
  int lastwrt;
  char fmtstr [8];
  float flt;
  int prec;
  char *strtimefmt;
  int32_t secfracs;
  tm *m_tm;
  rtosc_arg_t *val;
  size_t wrt;
  rtosc_arg_val_t *prev_arg_if_range_local;
  int *cols_used_local;
  rtosc_print_options *opt_local;
  size_t bs_local;
  char *buffer_local;
  rtosc_arg_val_t *arg_local;
  
  val = (rtosc_arg_t *)0x0;
  cols_used_local = (int *)opt;
  if (opt == (rtosc_print_options *)0x0) {
    cols_used_local = (int *)default_print_options;
  }
  arg_00 = &arg->val;
  local_120 = (ulong)((int)arg->type - 0x2d);
  switch(local_120) {
  case 0:
    iVar7 = rtosc_print_range((rtosc_arg_val_t *)last_pos,stack0xffffffffffffff78,
                              CONCAT44(fmtstr_1._1_4_,_auStack_90),(rtosc_print_options *)last_pos_1
                              ,piStack_a0,(rtosc_arg_val_t *)CONCAT44(s._4_4_,s._0_4_));
    val = (rtosc_arg_t *)(long)iVar7;
    break;
  default:
    break;
  case 0x19:
    fast_strcpy(&in_stack_fffffffffffffe50->type,
                (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0x11af11);
    val = (rtosc_arg_t *)0x5;
    break;
  case 0x1c:
    fast_strcpy(&in_stack_fffffffffffffe50->type,
                (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0x11af53);
    val = (rtosc_arg_t *)0x3;
    break;
  case 0x21:
    fast_strcpy(&in_stack_fffffffffffffe50->type,
                (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0x11af32);
    val = (rtosc_arg_t *)0x3;
    break;
  case 0x26:
  case 0x46:
    if (arg->type == 'S') {
      bVar14 = true;
      if ((*arg_00->s == '_') ||
         (ppuVar12 = __ctype_b_loc(), ((*ppuVar12)[(int)*arg_00->s] & 0x400) != 0)) {
        b = (char *)arg_00->h;
        while( true ) {
          b = b + 1;
          bVar2 = false;
          if (*b != '\0') {
            bVar2 = bVar14;
          }
          if (!bVar2) break;
          bVar14 = true;
          if (*b != '_') {
            ppuVar12 = __ctype_b_loc();
            bVar14 = ((*ppuVar12)[(int)*b] & 8) != 0;
          }
        }
      }
      else {
        bVar14 = false;
      }
    }
    else {
      bVar14 = false;
    }
    s_1 = buffer;
    if (!bVar14) {
      s_1 = buffer + 1;
      *buffer = '\"';
      *cols_used = *cols_used + 1;
    }
    for (_i = arg_00->s; *_i != '\0'; _i = _i + 1) {
      if ((!bVar14) && (cols_used_local[4] + -3 < *cols_used)) {
        break_string((char **)in_stack_fffffffffffffe50,
                     CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),(int *)0x11b623);
      }
      iVar7 = as_escaped_char((int)*_i,0);
      if (iVar7 == -1) {
        *s_1 = *_i;
        *cols_used = *cols_used + 1;
        s_1 = s_1 + 1;
      }
      else {
        pcVar9 = s_1 + 1;
        *s_1 = '\\';
        s_1 = s_1 + 2;
        *pcVar9 = (char)iVar7;
        *cols_used = *cols_used + 2;
        if ((!bVar14) && (iVar7 == 0x6e)) {
          break_string((char **)in_stack_fffffffffffffe50,
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),(int *)0x11b6ab
                      );
        }
      }
    }
    pcVar9 = s_1;
    if (!bVar14) {
      *s_1 = '\"';
      *cols_used = *cols_used + 1;
      pcVar9 = s_1 + 1;
      if (arg->type == 'S') {
        s_1[1] = 'S';
        pcVar9 = s_1 + 2;
      }
    }
    s_1 = pcVar9;
    *s_1 = '\0';
    val = (rtosc_arg_t *)(s_1 + -(long)buffer);
    break;
  case 0x27:
    fast_strcpy(&in_stack_fffffffffffffe50->type,
                (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0x11aef0);
    val = (rtosc_arg_t *)0x4;
    break;
  case 0x34:
    uVar5 = rtosc_arg_arr_len(arg_00);
    _conv = (ulong)uVar5;
    lVar1 = -(_conv * 0x18 + 0xf & 0xfffffffffffffff0);
    bs_local = (size_t)(buffer + 1);
    *buffer = '[';
    opt_local = (rtosc_print_options *)(bs - 1);
    val = (rtosc_arg_t *)0x1;
    *cols_used = *cols_used + 1;
    __vla_expr0 = (unsigned_long)&stack0xfffffffffffffe48;
    *(undefined8 *)(&stack0xfffffffffffffe40 + lVar1) = 0x11b96e;
    iVar6 = rtosc_arg_arr_len(arg_00);
    if (iVar6 == 0) {
      *(char *)bs_local = ' ';
      val = (rtosc_arg_t *)0x2;
      *cols_used = *cols_used + 1;
      bs_local = (size_t)(buffer + 2);
    }
    else {
      input._4_4_ = 1;
      while( true ) {
        iVar7 = input._4_4_;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar1) = 0x11b996;
        iVar6 = rtosc_arg_arr_len(arg_00);
        if (iVar6 < iVar7) break;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar1) = 0x11b9c8;
        rtosc_arg_arr_len(arg_00);
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar1) = 0x11b9eb;
        input._0_4_ = rtosc_convert_to_range
                                (*(rtosc_arg_val_t **)((long)&tmp_1 + lVar1),
                                 *(size_t *)((long)&stack0xfffffffffffffef0 + lVar1),
                                 *(rtosc_arg_val_t **)(&stack0xfffffffffffffee8 + lVar1),
                                 *(rtosc_print_options **)((long)&local_120 + lVar1));
        arg_01 = (rtosc_arg_val_t *)(&stack0xfffffffffffffe48 + lVar1);
        if ((int32_t)input == 0) {
          arg_01 = arg + input._4_4_;
        }
        local_190 = cols_used_local;
        if (input._4_4_ == 1) {
          prev_arg_if_range_00 = (rtosc_arg_val_t *)0x0;
        }
        else {
          prev_arg_if_range_00 = arg + (long)input._4_4_ + -1;
        }
        local_1a8 = arg_01;
        local_188 = cols_used;
        tmp_1 = (size_t)arg_01;
        *(undefined8 *)(&stack0xfffffffffffffe40 + lVar1) = 0x11bacb;
        sStack_110 = rtosc_print_arg_val(arg_01,(char *)bs_local,(size_t)opt_local,
                                         (rtosc_print_options *)cols_used_local,cols_used,
                                         prev_arg_if_range_00);
        iVar7 = (int32_t)input;
        if ((int32_t)input == 0) {
          *(undefined8 *)(&stack0xfffffffffffffe40 + lVar1) = 0x11bb00;
          iVar7 = next_arg_offset(*(rtosc_arg_val_t **)(&stack0xfffffffffffffe50 + lVar1));
        }
        input._4_4_ = iVar7 + input._4_4_;
        iVar4 = (int)sStack_110;
        local_114 = iVar4;
        puVar13 = (undefined1 *)(bs_local + (long)iVar4);
        iVar7 = cols_used_local[4];
        *(undefined1 **)((long)local_1c8 + lVar1) = &stack0xffffffffffffff1c;
        *(int *)(&stack0xfffffffffffffe40 + lVar1) = iVar7;
        *(undefined8 *)((long)local_1c8 + lVar1 + -8) = 0x11bb97;
        linebreak_check_after_write
                  (*(int **)(&stack0xfffffffffffffe60 + lVar1),
                   *(size_t **)((long)&local_1a8 + lVar1),
                   *(char **)(&stack0xfffffffffffffe50 + lVar1),
                   *(char ***)(&stack0xfffffffffffffe48 + lVar1),
                   *(size_t **)(&stack0xfffffffffffffe40 + lVar1),
                   *(size_t *)((long)local_1c8 + lVar1),*(int **)((long)&local_190 + lVar1),
                   *(int *)((long)&local_188 + lVar1));
        bs_local = (size_t)(puVar13 + 1);
        *puVar13 = 0x20;
        opt_local = (rtosc_print_options *)((long)opt_local + (-1 - (long)iVar4));
        val = (rtosc_arg_t *)((long)val + (long)iVar4 + 1);
        *cols_used = *cols_used + 1;
      }
    }
    *(undefined1 *)(bs_local - 1) = 0x5d;
    *(undefined1 *)bs_local = 0;
    *cols_used = *cols_used + 1;
    break;
  case 0x35:
    iVar7 = asnprintf(buffer,bs,"BLOB [%d ",(ulong)(uint)arg_00->i);
    val = (rtosc_arg_t *)(long)iVar7;
    *cols_used = *cols_used + iVar7;
    bs_local = (long)val + (long)buffer;
    opt_local = (rtosc_print_options *)bs;
    for (_n2 = 0; _n2 < arg_00->i; _n2 = _n2 + 1) {
      if (cols_used_local[4] + -6 <= *cols_used) {
        iVar7 = asnprintf((char *)(bs_local - 1),(size_t)&opt_local->field_0x1,"\n    ");
        val = (rtosc_arg_t *)((long)(iVar7 + -1) + (long)val);
        bs_local = bs_local + (long)(iVar7 + -1);
        *cols_used = 4;
      }
      asnprintf((char *)bs_local,(size_t)opt_local,"0x%02x ",(ulong)(arg->val).b.data[_n2]);
      opt_local = (rtosc_print_options *)((long)&opt_local[-1].linelength + 3);
      bs_local = bs_local + 5;
      val = (rtosc_arg_t *)(val->m + 5);
      *cols_used = *cols_used + 5;
    }
    *(undefined1 *)(bs_local - 1) = 0x5d;
    break;
  case 0x36:
    iVar7 = as_escaped_char(arg_00->i,1);
    pcVar9 = "";
    if (iVar7 == -1) {
      local_15c = arg_00->i;
    }
    else {
      pcVar9 = "\\";
      local_15c = as_escaped_char(arg_00->i,1);
    }
    iVar7 = asnprintf(buffer,bs,"\'%s%c\'",pcVar9,(ulong)local_15c);
    val = (rtosc_arg_t *)(long)iVar7;
    break;
  case 0x37:
  case 0x39:
    fmtstr_1._1_4_ = cols_used_local[1];
    if (arg->type == 'f') {
      asnprintf((char *)((long)&last_pos_1 + 3),6,"%%#.%df",(ulong)(uint)fmtstr_1._1_4_);
      iVar7 = asnprintf((char *)(double)arg_00->f,(size_t)buffer,(char *)bs,(long)&last_pos_1 + 3);
      val = (rtosc_arg_t *)(long)iVar7;
      if ((*cols_used_local & 1) != 0) {
        iVar7 = asnprintf((char *)(double)arg_00->f,(size_t)(buffer + (long)val),
                          (char *)(bs - (long)val)," (%a)");
        sVar11 = remove_trailing_zeroes(in_stack_fffffffffffffe80);
        val = (rtosc_arg_t *)((long)val + ((long)iVar7 - sVar11));
      }
    }
    else {
      asnprintf((char *)((long)&last_pos_1 + 3),8,"%%#.%dlfd",(ulong)(uint)fmtstr_1._1_4_);
      iVar7 = asnprintf(arg_00->s,(size_t)buffer,(char *)bs,(long)&last_pos_1 + 3);
      val = (rtosc_arg_t *)(long)iVar7;
      if ((*cols_used_local & 1) != 0) {
        iVar7 = asnprintf(arg_00->s,(size_t)(buffer + (long)val),(char *)(bs - (long)val)," (%la)");
        val = (rtosc_arg_t *)((long)iVar7 + (long)val);
      }
    }
    break;
  case 0x3b:
    iVar7 = asnprintf(buffer,bs,"%ldh",arg_00->d);
    val = (rtosc_arg_t *)(long)iVar7;
    break;
  case 0x3c:
    iVar7 = asnprintf(buffer,bs,"%d",(ulong)(uint)arg_00->i);
    val = (rtosc_arg_t *)(long)iVar7;
    break;
  case 0x40:
    local_1c8[0] = (uint)(arg->val).m[3];
    uStackY_1d0 = 0x11b489;
    iVar7 = asnprintf(buffer,bs,"MIDI [0x%02x 0x%02x 0x%02x 0x%02x]",(ulong)arg_00->m[0],
                      (ulong)(arg->val).m[1],(ulong)(arg->val).m[2]);
    val = (rtosc_arg_t *)(long)iVar7;
    break;
  case 0x45:
    local_1c8[0] = arg_00->i & 0xff;
    uStackY_1d0 = 0x11b205;
    iVar7 = asnprintf(buffer,bs,"#%02x%02x%02x%02x",(ulong)(arg_00->i >> 0x18 & 0xff),
                      (ulong)(arg_00->i >> 0x10 & 0xff),(ulong)(arg_00->i >> 8 & 0xff));
    val = (rtosc_arg_t *)(long)iVar7;
    break;
  case 0x47:
    _Var3 = rtosc_arg_val_is_immediatelly(arg);
    if (_Var3) {
      iVar7 = asnprintf(buffer,bs,"immediately");
      val = (rtosc_arg_t *)(long)iVar7;
    }
    else {
      __tp = rtosc_params_from_arg_val(in_stack_fffffffffffffe50);
      uVar8 = rtosc_secfracs_from_arg_val(arg);
      if (((int)uVar8 == 0) && (__tp->tm_sec == 0)) {
        bVar14 = true;
        if (__tp->tm_hour == 0) {
          bVar14 = __tp->tm_min != 0;
        }
        local_128 = "%Y-%m-%d";
        if (bVar14) {
          local_128 = "%Y-%m-%d %H:%M";
        }
      }
      else {
        local_128 = "%Y-%m-%d %H:%M:%S";
      }
      val = (rtosc_arg_t *)strftime(buffer,bs,local_128,(tm *)__tp);
      if ((int)uVar8 != 0) {
        fmtstr._4_4_ = cols_used_local[1];
        fmtstr._0_4_ = rtosc_secfracs2float(in_stack_fffffffffffffe60);
        asnprintf(local_70,5,"%%.%df",(ulong)(uint)fmtstr._4_4_);
        iVar7 = (int)val;
        iVar4 = asnprintf((char *)(double)(float)fmtstr._0_4_,(size_t)(buffer + (long)val),
                          (char *)(bs - (long)val),local_70);
        pcVar9 = strchr(buffer + iVar7,0x2e);
        sVar10 = strlen(pcVar9);
        memmove(buffer + iVar7,pcVar9,sVar10 + 1);
        val = (rtosc_arg_t *)((long)val + ((long)iVar4 - ((long)pcVar9 - (long)(buffer + iVar7))));
        if ((*cols_used_local & 1) != 0) {
          register0x00000000 = buffer + (long)val;
          iVar7 = asnprintf((char *)(double)(float)fmtstr._0_4_,(size_t)(buffer + (long)val),
                            (char *)(bs - (long)val)," (...+%as)");
          sVar11 = remove_trailing_zeroes(in_stack_fffffffffffffe80);
          val = (rtosc_arg_t *)((long)val + ((long)iVar7 - sVar11));
        }
      }
    }
  }
  iVar7 = (int)arg->type;
  if ((((iVar7 != 0x2d) && (iVar7 != 0x53)) && (1 < iVar7 - 0x61U)) && (iVar7 != 0x73)) {
    *cols_used = *cols_used + (int)val;
  }
  return (size_t)val;
}

Assistant:

size_t rtosc_print_arg_val(const rtosc_arg_val_t *arg,
                           char *buffer, size_t bs,
                           const rtosc_print_options* opt, int *cols_used, const rtosc_arg_val_t* prev_arg_if_range)
{
    size_t wrt = 0;
    if(!opt)
        opt = default_print_options;
    assert(arg);
    const rtosc_arg_t* val = &arg->val;

    switch(arg->type)
    {
        case 'T':
            assert(bs>4);
            fast_strcpy(buffer, "true", bs);
            wrt = 4;
            break;
        case 'F':
            assert(bs>5);
            fast_strcpy(buffer, "false", bs);
            wrt = 5;
            break;
        case 'N':
            assert(bs>3);
            fast_strcpy(buffer, "nil", bs);
            wrt = 3;
            break;
        case 'I':
            assert(bs>3);
            fast_strcpy(buffer, "inf", bs);
            wrt = 3;
            break;
        case 'h':
            wrt = asnprintf(buffer, bs, "%"PRId64"h", val->h);
            break;
        case 't': // write to ISO 8601 date
        {
            if(rtosc_arg_val_is_immediatelly(arg))
                wrt = asnprintf(buffer, bs, "immediately");
            else
            {
                struct tm* m_tm = rtosc_params_from_arg_val(arg);
                int32_t secfracs = rtosc_secfracs_from_arg_val(arg);

                const char* strtimefmt = (secfracs || m_tm->tm_sec)
                                  ? "%Y-%m-%d %H:%M:%S"
                                  : (m_tm->tm_hour || m_tm->tm_min)
                                    ? "%Y-%m-%d %H:%M"
                                    : "%Y-%m-%d";

                wrt = strftime(buffer, bs, strtimefmt, m_tm);
                assert(wrt);

                if(secfracs)
                {
                    int prec = opt->floating_point_precision;
                    assert(prec>=0);
                    assert(prec<100);

                    // convert fractions -> float
                    float flt = rtosc_secfracs2float(secfracs);

                    // append float
                    char fmtstr[8];
                    asnprintf(fmtstr, 5, "%%.%df", prec);
                    int lastwrt = wrt;
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     fmtstr, flt);
                    // snip part before separator
                    const char* sep = strchr(buffer + lastwrt, '.');
                    assert(sep);
                    memmove(buffer + lastwrt, sep, strlen(sep)+1);
                    wrt -= (sep - (buffer + lastwrt));

                    if(opt->lossless) {
                        char* last_pos = buffer + wrt;
                        wrt += asnprintf(buffer + wrt, bs - wrt,
                                         " (...+%as)", flt);
                        wrt -= remove_trailing_zeroes(last_pos+6);
                    }
                } // if secfracs
            } // else
            break;
        }
        case 'r':
            wrt = asnprintf(buffer, bs, "#%02x%02x%02x%02x",
                      (val->i >> 24) & 0xff,
                      (val->i >> 16) & 0xff,
                      (val->i >>  8) & 0xff,
                       val->i        & 0xff
                      );
            break;
        case 'd':
        case 'f':
        {
            int prec = opt->floating_point_precision;
            assert(prec>=0);
            assert(prec<100);
            char fmtstr[9];
            if(arg->type == 'f')
            {
                // e.g. "%.42f" or "%.0f.":
                asnprintf(fmtstr, 6, "%%#.%df", prec);
                wrt = asnprintf(buffer, bs, fmtstr, val->f);
                if(opt->lossless)
                {
                    char* last_pos = buffer + wrt;
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     " (%a)", val->f);
                    wrt -= remove_trailing_zeroes(last_pos+2);
                }
            }
            else
            {
                // e.g. "%.42lfd" or "%.0lf.d"
                asnprintf(fmtstr, 8, "%%#.%dlfd", prec);
                wrt = asnprintf(buffer, bs, fmtstr, val->d);
                if(opt->lossless)
                    wrt += asnprintf(buffer + wrt, bs - wrt,
                                     " (%la)", val->d);
            }
            break;
        }
        case 'c':
        {
            int is_esc = (as_escaped_char(val->i, true) != -1);
            wrt = asnprintf(buffer, bs, "'%s%c'",
                            is_esc ? "\\" : "",
                            is_esc ? as_escaped_char(val->i, true)
                                   : val->i);
            break;
        }
        case 'i':
            wrt = asnprintf(buffer, bs, "%"PRId32, val->i);
            break;
        case 'm':
            wrt = asnprintf(buffer, bs, "MIDI [0x%02x 0x%02x 0x%02x 0x%02x]",
                            val->m[0], val->m[1], val->m[2], val->m[3]);
            break;
        case 's':
        case 'S':
        {
            bool plain; // e.g. without quotes
            if(arg->type == 'S')
            {
                plain = true; // "Symbol": are quotes required?
                if(*val->s != '_' && !isalpha(*val->s))
                    plain = false;
                else for(const char* s = val->s + 1; *s && plain; ++s)
                    plain = (*s == '_' || (isalnum(*s)));
            }
            else plain = false;

            char* b = buffer;
            if(!plain)
            {
                *b++ = '"';
                ++*cols_used;
            }
            for(const char* s = val->s; *s; ++s)
            {
                // "3": 2 quote signs and escaping backslash
                if(!plain && *cols_used > opt->linelength - 3)
                    break_string(&b, bs, cols_used);
                assert(bs);
                int as_esc = as_escaped_char(*s, false);
                if(as_esc != -1) {
                    assert(bs-1);
                    *b++ = '\\';
                    *b++ = as_esc;
                    *cols_used += 2;
                    if(!plain && as_esc == 'n')
                        break_string(&b, bs, cols_used);
                }
                else {
                    *b++ = *s;
                    ++*cols_used;
                }
            }

            if(plain)
                assert(bs);
            else
            {
                assert(bs >= 2);
                *b++ = '"';
                ++*cols_used;
                if(arg->type == 'S') {
                    assert(bs >= 2);
                    *b++ = 'S';
                }
            }
            *b = 0;
            wrt += (b-buffer);
            break;
        }
        case 'b':
            wrt = asnprintf(buffer, bs, "BLOB [%d ", val->b.len);
            *cols_used += wrt;
            buffer += wrt;
            for(int32_t i = 0; i < val->b.len; ++i)
            {
                if(*cols_used >= opt->linelength - 6)
                {
                    int tmp = asnprintf(buffer-1, bs+1, "\n    ");
                    wrt += (tmp-1);
                    buffer += (tmp-1);
                    *cols_used = 4;
                }
                asnprintf(buffer, bs, "0x%02x ", val->b.data[i]);
                COUNT_UP_COL(5);
            }
            buffer[-1] = ']';
            break;
        case 'a':
        {
            char* last_sep = buffer - 1;
            int args_written_this_line = (cols_used) ? 1 : 0;
            STACKALLOC(rtosc_arg_val_t, args_converted, rtosc_arg_arr_len(val)); // range conversion

            COUNT_UP_WRITE('[');
            if(rtosc_arg_arr_len(val))
            for(int32_t i = 1; i <= rtosc_arg_arr_len(val); )
            {
                int32_t conv = rtosc_convert_to_range(arg+i, rtosc_arg_arr_len(val)+1-i, args_converted, opt);
                const rtosc_arg_val_t* input = conv ? args_converted : arg+i;

                size_t tmp = rtosc_print_arg_val(input, buffer, bs,
                                                 opt, cols_used, (i == 1) ? NULL : arg + i -1);
                i += conv ? conv : next_arg_offset(arg+i);
                COUNT_UP(tmp);

                linebreak_check_after_write(cols_used, &wrt,
                                            last_sep, &buffer, &bs,
                                            tmp, &args_written_this_line,
                                            opt->linelength);

                last_sep = buffer;
                COUNT_UP_WRITE(' ');
            }
            else
                COUNT_UP_WRITE(' ');

            assert(bs);
            buffer[-1] = ']';
            *buffer = 0;
            ++*cols_used;
            --bs;
            break;
        }
        case '-':
        {
            wrt += rtosc_print_range(arg, buffer, bs, opt, cols_used, prev_arg_if_range);
            break;
        }
        default:
            ;
    }

    switch(arg->type)
    {
        case '-':
        case 'a':
        case 's':
        case 'S':
        case 'b':
            // these can break the line, so they compute *cols_used themselves
            break;
        default:
            *cols_used += wrt;
    }

    return wrt;
}